

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

long duckdb::GreatestCommonDivisor<long>(long left,long right)

{
  int64_t iVar1;
  long b;
  long input;
  long a;
  
  if ((right != -1 || left != -0x8000000000000000) && (right != -0x8000000000000000 || left != -1))
  {
    for (; (input = right, left != 0 && (right = right % left, input = left, right != 0));
        left = left % right) {
    }
    iVar1 = TryAbsOperator::Operation<long,long>(input);
    return iVar1;
  }
  return 1;
}

Assistant:

TA GreatestCommonDivisor(TA left, TA right) {
	TA a = left;
	TA b = right;

	// This protects the following modulo operations from a corner case,
	// where we would get a runtime error due to an integer overflow.
	if ((left == NumericLimits<TA>::Minimum() && right == -1) ||
	    (left == -1 && right == NumericLimits<TA>::Minimum())) {
		return 1;
	}

	while (true) {
		if (a == 0) {
			return TryAbsOperator::Operation<TA, TA>(b);
		}
		b %= a;

		if (b == 0) {
			return TryAbsOperator::Operation<TA, TA>(a);
		}
		a %= b;
	}
}